

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetBindFlagString(Uint32 BindFlag)

{
  char *pcVar1;
  uint *in_RCX;
  uint in_EDI;
  uint uVar2;
  string msg;
  char local_3c [4];
  string local_38;
  
  if (in_EDI == 0) {
    return "BIND_NONE";
  }
  uVar2 = in_EDI - 1;
  if ((in_EDI & uVar2) != 0) {
    FormatString<char[37]>(&local_38,(char (*) [37])"More than one bind flag is specified");
    in_RCX = (uint *)0x487;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetBindFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x487);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (uVar2 < 8) {
    in_RCX = (uint *)((long)&switchD_00609103::switchdataD_007f39ec +
                     (long)(int)(&switchD_00609103::switchdataD_007f39ec)[uVar2]);
    switch(uVar2) {
    case 0:
      pcVar1 = "BIND_VERTEX_BUFFER";
      break;
    case 1:
      pcVar1 = "BIND_INDEX_BUFFER";
      break;
    default:
      goto switchD_00609103_caseD_2;
    case 3:
      pcVar1 = "BIND_UNIFORM_BUFFER";
      break;
    case 7:
      pcVar1 = "BIND_SHADER_RESOURCE";
    }
  }
  else {
    if (in_EDI == 0x10) {
      return "BIND_STREAM_OUTPUT";
    }
    if (in_EDI == 0x20) {
      return "BIND_RENDER_TARGET";
    }
    if (in_EDI == 0x40) {
      return "BIND_DEPTH_STENCIL";
    }
    if (in_EDI == 0x80) {
      return "BIND_UNORDERED_ACCESS";
    }
    if (in_EDI == 0x100) {
      return "BIND_INDIRECT_DRAW_ARGS";
    }
    if (in_EDI == 0x200) {
      return "BIND_INPUT_ATTACHMENT";
    }
    if (in_EDI == 0x400) {
      return "BIND_RAY_TRACING";
    }
    if (in_EDI == 0x800) {
      return "BIND_SHADING_RATE";
    }
switchD_00609103_caseD_2:
    FormatString<char[22],unsigned_int>
              (&local_38,(Diligent *)"Unexpected bind flag ",(char (*) [22])local_3c,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetBindFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x49c);
    std::__cxx11::string::~string((string *)&local_38);
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const Char* GetBindFlagString(Uint32 BindFlag)
{
    VERIFY(BindFlag == BIND_NONE || IsPowerOfTwo(BindFlag), "More than one bind flag is specified");

    static_assert(BIND_FLAG_LAST == 0x800L, "Please handle the new bind flag in the switch below");
    switch (BindFlag)
    {
#define BIND_FLAG_STR_CASE(Flag) \
    case Flag: return #Flag;
        BIND_FLAG_STR_CASE(BIND_NONE)
        BIND_FLAG_STR_CASE(BIND_VERTEX_BUFFER)
        BIND_FLAG_STR_CASE(BIND_INDEX_BUFFER)
        BIND_FLAG_STR_CASE(BIND_UNIFORM_BUFFER)
        BIND_FLAG_STR_CASE(BIND_SHADER_RESOURCE)
        BIND_FLAG_STR_CASE(BIND_STREAM_OUTPUT)
        BIND_FLAG_STR_CASE(BIND_RENDER_TARGET)
        BIND_FLAG_STR_CASE(BIND_DEPTH_STENCIL)
        BIND_FLAG_STR_CASE(BIND_UNORDERED_ACCESS)
        BIND_FLAG_STR_CASE(BIND_INDIRECT_DRAW_ARGS)
        BIND_FLAG_STR_CASE(BIND_INPUT_ATTACHMENT)
        BIND_FLAG_STR_CASE(BIND_RAY_TRACING)
        BIND_FLAG_STR_CASE(BIND_SHADING_RATE)
#undef BIND_FLAG_STR_CASE
        default: UNEXPECTED("Unexpected bind flag ", BindFlag); return "";
    }
}